

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*>::expand
          (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*>
           *this)

{
  size_t sVar1;
  Node **ppNVar2;
  Node **ppNVar3;
  ulong uVar4;
  size_t i;
  size_t sVar5;
  size_t sVar6;
  
  sVar6 = 8;
  if (this->_capacity != 0) {
    sVar6 = this->_capacity * 2;
  }
  uVar4 = sVar6 * 8;
  if (uVar4 == 0) {
    ppNVar3 = (Node **)FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x11) {
    ppNVar3 = (Node **)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
  }
  else if (uVar4 < 0x19) {
    ppNVar3 = (Node **)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
  }
  else if (uVar4 < 0x21) {
    ppNVar3 = (Node **)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
  }
  else if (uVar4 < 0x31) {
    ppNVar3 = (Node **)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
  }
  else if (uVar4 < 0x41) {
    ppNVar3 = (Node **)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
  }
  else {
    ppNVar3 = (Node **)::operator_new(uVar4,0x10);
  }
  sVar1 = this->_capacity;
  if (sVar1 != 0) {
    sVar5 = 0;
    do {
      ppNVar3[sVar5] = this->_stack[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
    ppNVar2 = this->_stack;
    if (ppNVar2 != (Node **)0x0) {
      uVar4 = sVar1 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *ppNVar2 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppNVar2;
      }
      else if (uVar4 < 0x11) {
        *ppNVar2 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppNVar2;
      }
      else if (uVar4 < 0x19) {
        *ppNVar2 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppNVar2;
      }
      else if (uVar4 < 0x21) {
        *ppNVar2 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppNVar2;
      }
      else if (uVar4 < 0x31) {
        *ppNVar2 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppNVar2;
      }
      else if (uVar4 < 0x41) {
        *ppNVar2 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppNVar2;
      }
      else {
        operator_delete(ppNVar2,0x10);
      }
    }
  }
  this->_stack = ppNVar3;
  this->_cursor = ppNVar3 + this->_capacity;
  this->_end = ppNVar3 + sVar6;
  this->_capacity = sVar6;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }